

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  LogMessage *pLVar2;
  void **our_elems;
  int iVar3;
  LogMessage local_60 [63];
  LogFinisher local_21;
  
  if (other == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_60,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_21,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_60);
  }
  iVar3 = other->current_size_;
  if (iVar3 != 0) {
    pRVar1 = other->rep_;
    our_elems = (void **)google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend((int)this)
    ;
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
              (this,our_elems,pRVar1->elements,iVar3,
               this->rep_->allocated_size - this->current_size_);
    iVar3 = iVar3 + this->current_size_;
    this->current_size_ = iVar3;
    if (this->rep_->allocated_size < iVar3) {
      this->rep_->allocated_size = iVar3;
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}